

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_EnumValueFeaturesInherit_Test::TestBody
          (FeaturesTest_EnumValueFeaturesInherit_Test *this)

{
  bool bVar1;
  Descriptor *this_00;
  FileDescriptor *file_00;
  EnumDescriptor *this_01;
  char *pcVar2;
  FeatureSet *pFVar3;
  ConstType this_02;
  _Head_base<0UL,_const_char_*,_false> in_stack_fffffffffffffee0;
  AssertHelper local_c0;
  Message local_b8;
  EnumFeature local_b0;
  EnumFeature local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_2;
  Message local_90;
  FeatureSet_EnumType local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_68 [3];
  protobuf local_50 [8];
  char local_48 [8];
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  EnumValueDescriptor *value;
  FileDescriptor *local_18;
  FileDescriptor *file;
  FeaturesTest_EnumValueFeaturesInherit_Test *this_local;
  
  file = (FileDescriptor *)this;
  ValidationErrorTest::BuildDescriptorMessagesInTestPool((ValidationErrorTest *)this);
  this_00 = pb::TestFeatures::descriptor();
  file_00 = Descriptor::file(this_00);
  ValidationErrorTest::BuildFileInTestPool((ValidationErrorTest *)this,file_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&value,
             "\n    name: \"foo.proto\"\n    syntax: \"editions\"\n    edition: EDITION_2023\n    dependency: \"google/protobuf/unittest_features.proto\"\n    options { features { enum_type: CLOSED } }\n    enum_type {\n      name: \"Foo\"\n      options {\n        features {\n          [pb.test] { enum_feature: VALUE9 }\n        }\n      }\n      value { name: \"BAR\" number: 0 }\n    }\n  "
            );
  local_18 = ValidationErrorTest::BuildFile((ValidationErrorTest *)this,_value);
  this_01 = FileDescriptor::enum_type(local_18,0);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )EnumDescriptor::value(this_01,0);
  EqualsProto<char_const*>(local_50,anon_var_dwarf_37cdd0 + 5);
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>
            ((EqualsProtoMatcherP<const_char_*>)in_stack_fffffffffffffee0._M_head_impl);
  EnumValueDescriptor::options
            ((EnumValueDescriptor *)
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
            ((AssertionResult *)local_40,local_48,(EnumValueOptions *)"value->options()");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x27bd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  pFVar3 = GetFeatures<google::protobuf::EnumValueDescriptor>
                     ((EnumValueDescriptor *)
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_84 = FeatureSet::enum_type(pFVar3);
  testing::internal::EqHelper::
  Compare<google::protobuf::FeatureSet_EnumType,_google::protobuf::FeatureSet_EnumType,_nullptr>
            ((EqHelper *)local_80,"GetFeatures(value).enum_type()","FeatureSet::CLOSED",&local_84,
             &FeatureSet::CLOSED);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x27be,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  pFVar3 = GetFeatures<google::protobuf::EnumValueDescriptor>
                     ((EnumValueDescriptor *)
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  this_02 = FeatureSet::
            GetExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false,_0>
                      (pFVar3,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                               *)pb::test);
  local_ac = pb::TestFeatures::enum_feature(this_02);
  local_b0 = VALUE9;
  testing::internal::EqHelper::Compare<pb::EnumFeature,_pb::EnumFeature,_nullptr>
            ((EqHelper *)local_a8,"GetFeatures(value).GetExtension(pb::test).enum_feature()",
             "pb::VALUE9",&local_ac,&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x27c0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  return;
}

Assistant:

TEST_F(FeaturesTest, EnumValueFeaturesInherit) {
  BuildDescriptorMessagesInTestPool();
  BuildFileInTestPool(pb::TestFeatures::descriptor()->file());
  const FileDescriptor* file = BuildFile(R"pb(
    name: "foo.proto"
    syntax: "editions"
    edition: EDITION_2023
    dependency: "google/protobuf/unittest_features.proto"
    options { features { enum_type: CLOSED } }
    enum_type {
      name: "Foo"
      options {
        features {
          [pb.test] { enum_feature: VALUE9 }
        }
      }
      value { name: "BAR" number: 0 }
    }
  )pb");
  const EnumValueDescriptor* value = file->enum_type(0)->value(0);
  EXPECT_THAT(value->options(), EqualsProto(""));
  EXPECT_EQ(GetFeatures(value).enum_type(), FeatureSet::CLOSED);
  EXPECT_EQ(GetFeatures(value).GetExtension(pb::test).enum_feature(),
            pb::VALUE9);
}